

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

void nghttp2_frame_push_promise_init
               (nghttp2_push_promise *frame,uint8_t flags,int32_t stream_id,
               int32_t promised_stream_id,nghttp2_nv *nva,size_t nvlen)

{
  (frame->hd).length = 0;
  (frame->hd).type = '\x05';
  (frame->hd).flags = flags;
  (frame->hd).stream_id = stream_id;
  (frame->hd).reserved = '\0';
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->promised_stream_id = promised_stream_id;
  frame->reserved = '\0';
  return;
}

Assistant:

void nghttp2_frame_push_promise_init(nghttp2_push_promise *frame, uint8_t flags,
                                     int32_t stream_id,
                                     int32_t promised_stream_id,
                                     nghttp2_nv *nva, size_t nvlen) {
  nghttp2_frame_hd_init(&frame->hd, 0, NGHTTP2_PUSH_PROMISE, flags, stream_id);
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->promised_stream_id = promised_stream_id;
  frame->reserved = 0;
}